

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitRethrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Rethrow *curr)

{
  bool bVar1;
  uint uVar2;
  WasmException *pWVar3;
  WasmException *pWVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = ((int)((ulong)((long)(this->exceptionStack).flexible.
                               super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->exceptionStack).flexible.
                              super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d +
          (int)(this->exceptionStack).usedFixed) - 1;
  if (-1 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
    pWVar4 = &(this->exceptionStack).fixed._M_elems[uVar5].first;
    lVar6 = uVar5 * 0x58 + -0x160;
    do {
      pWVar3 = (WasmException *)
               ((long)(&(((this->exceptionStack).flexible.
                          super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first).values.
                        super_SmallVector<wasm::Literal,_1UL>.fixed + -1) + lVar6);
      if (uVar5 < 4) {
        pWVar3 = pWVar4;
      }
      if (pWVar3[1].tag.super_IString.str._M_str == (curr->target).super_IString.str._M_str) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[4])(this);
      }
      pWVar4 = (WasmException *)((long)(pWVar4 + -2) + 0x38);
      lVar6 = lVar6 + -0x58;
      bVar1 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
  }
  handle_unreachable("rethrow",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0xea9);
}

Assistant:

Flow visitRethrow(Rethrow* curr) {
    for (int i = exceptionStack.size() - 1; i >= 0; i--) {
      if (exceptionStack[i].second == curr->target) {
        throwException(exceptionStack[i].first);
      }
    }
    WASM_UNREACHABLE("rethrow");
  }